

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

void munmap_checked(void *addr,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  int iVar4;
  ulong uVar5;
  void *ptr;
  uint uVar6;
  ulong *puVar7;
  ulong local_58;
  char buf [64];
  
  iVar4 = munmap(addr,size);
  if (iVar4 == 0) {
    return;
  }
  puVar7 = &local_58;
  munmap_checked_cold_1();
  do {
    uVar2 = *puVar7;
    if ((ulong *)(uVar2 & 0xffffffffffff0000) == (ulong *)0x0) {
      uVar2 = puVar7[5];
      if ((ulong)(uint)uVar2 == 0) {
        __assert_fail("size_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x89,"ssize_t quota_use(struct quota *, size_t)");
      }
      puVar3 = (ulong *)puVar7[4];
      while( true ) {
        uVar5 = *puVar3;
        uVar6 = (uint)uVar5 + (int)((ulong)(uint)uVar2 + 0x3ff >> 10);
        if (uVar6 <= (uint)uVar5) {
          __assert_fail("new_used_in_units > used_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x90,"ssize_t quota_use(struct quota *, size_t)");
        }
        if ((uint)(uVar5 >> 0x20) < uVar6) break;
        LOCK();
        uVar1 = *puVar3;
        if (uVar5 == uVar1) {
          *puVar3 = (ulong)uVar6 | uVar5 & 0xffffffff00000000;
        }
        UNLOCK();
        if (uVar5 == uVar1) {
          LOCK();
          puVar3 = puVar7 + 3;
          uVar2 = *puVar3;
          *puVar3 = *puVar3 + (ulong)(uint)puVar7[5];
          UNLOCK();
          uVar5 = (ulong)(uint)puVar7[5];
          if (puVar7[2] < uVar2 + uVar5) {
            ptr = mmap_checked(uVar5,uVar5,*(int *)((long)puVar7 + 0x2c));
            if (ptr == (void *)0x0) {
              LOCK();
              puVar7[3] = puVar7[3] - (ulong)(uint)puVar7[5];
              UNLOCK();
              uVar2 = puVar7[5];
              if ((ulong)(uint)uVar2 == 0) {
                __assert_fail("size_in_units",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                              ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
              }
              puVar7 = (ulong *)puVar7[4];
              do {
                uVar5 = *puVar7;
                uVar6 = (uint)((ulong)(uint)uVar2 + 0x3ff >> 10);
                if ((uint)uVar5 < uVar6) {
                  __assert_fail("size_in_units <= used_in_units",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                                ,0xab,"ssize_t quota_release(struct quota *, size_t)");
                }
                LOCK();
                uVar1 = *puVar7;
                if (uVar5 == uVar1) {
                  *puVar7 = (ulong)((uint)uVar5 - uVar6) | uVar5 & 0xffffffff00000000;
                }
                UNLOCK();
              } while (uVar5 != uVar1);
            }
            else {
              madvise_checked(ptr,(ulong)(uint)puVar7[5],*(int *)((long)puVar7 + 0x2c));
            }
          }
          return;
        }
      }
      return;
    }
    LOCK();
    uVar5 = *puVar7;
    if (uVar2 == uVar5) {
      *puVar7 = uVar2 & 0xffff | *(ulong *)(uVar2 & 0xffffffffffff0000) & 0xffffffffffff0000;
      uVar5 = uVar2;
    }
    UNLOCK();
  } while (uVar2 != uVar5);
  return;
}

Assistant:

static void
munmap_checked(void *addr, size_t size)
{
	if (munmap(addr, size)) {
		char buf[64];
		intptr_t ignore_it = (intptr_t)strerror_r(errno, buf,
							  sizeof(buf));
		(void)ignore_it;
		fprintf(stderr, "Error in munmap(%p, %zu): %s\n",
			addr, size, buf);
		assert(false);
	}
}